

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O3

size_t tool_header_cb(char *ptr,size_t size,size_t nmemb,void *userdata)

{
  byte *pbVar1;
  HdrCbData *hdrcbdata;
  OutStruct *outs;
  byte *pbVar2;
  char cVar3;
  undefined8 uVar4;
  _Bool _Var5;
  int iVar6;
  uint __c;
  size_t sVar7;
  byte *pbVar8;
  undefined8 uVar9;
  void *pvVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  byte bVar14;
  FILE *__s;
  ulong __n;
  FILE *stream;
  OperationConfig *config;
  byte *pbVar15;
  ulong uVar16;
  curl_slist *old;
  char *scheme_1;
  long response;
  char *scheme;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  long local_48;
  char *local_40;
  long local_38;
  
  local_40 = (char *)0x0;
  if (*(long *)((long)userdata + 0x10) == 0) {
    return 0xffffffff;
  }
  __n = nmemb * size;
  if ((*(long *)(*(long *)((long)userdata + 0x10) + 0xe0) != 0) &&
     (*(FILE **)((long)userdata + 0x108) != (FILE *)0x0)) {
    sVar7 = fwrite(ptr,size,nmemb,*(FILE **)((long)userdata + 0x108));
    if (sVar7 != __n) {
      return sVar7;
    }
    iVar6 = fflush(*(FILE **)((long)userdata + 0x108));
    if (iVar6 != 0) {
      errorf(*(GlobalConfig **)(*(long *)((long)userdata + 0x10) + 0x528),
             "Failed writing headers to %s",*(undefined8 *)(*(long *)((long)userdata + 0x10) + 0xe0)
            );
      return 0xffffffff;
    }
  }
  hdrcbdata = (HdrCbData *)((long)userdata + 0x148);
  outs = (OutStruct *)((long)userdata + 0xd0);
  pbVar2 = (byte *)(ptr + __n);
  curl_easy_getinfo(*(undefined8 *)((long)userdata + 0x20),0x100031,&local_40);
  local_40 = proto_token(local_40);
  if ((local_40 == proto_http) || (local_40 == proto_https)) {
    local_48 = 0;
    curl_easy_getinfo(*(undefined8 *)((long)userdata + 0x20),0x200002,&local_48);
    if (local_48 - 200U < 200) {
      if (((*(long *)(*(long *)((long)userdata + 0x10) + 0x300) == 0) ||
          (*(long *)((long)userdata + 0x130) == 0)) ||
         (iVar6 = curl_strnequal(ptr,"etag:",5), iVar6 == 0)) {
        if (*(char *)((long)userdata + 0x178) == '\x01') {
          if ((0x14 < __n) && (iVar6 = curl_strnequal(ptr,"Content-disposition:",0x14), iVar6 != 0))
          {
            pbVar15 = (byte *)(ptr + 0x14);
            while( true ) {
              for (; ((pbVar15 < pbVar2 && (*pbVar15 != 0)) &&
                     ((byte)((*pbVar15 & 0xdf) + 0xa5) < 0xe6)); pbVar15 = pbVar15 + 1) {
              }
              if (pbVar2 + -9 < pbVar15) goto LAB_0010b5dd;
              if (pbVar15[8] == 0x3d && *(long *)pbVar15 == 0x656d616e656c6966) break;
              while( true ) {
                if ((pbVar2 <= pbVar15) || (*pbVar15 == 0)) goto LAB_0010b5dd;
                if (*pbVar15 == 0x3b) break;
                pbVar15 = pbVar15 + 1;
              }
            }
            pbVar15 = pbVar15 + 9;
            pbVar8 = (byte *)malloc((size_t)(ptr + (__n - (long)pbVar15) + 1));
            if (pbVar8 != (byte *)0x0) {
              memcpy(pbVar8,pbVar15,(size_t)(ptr + (__n - (long)pbVar15)));
              pbVar8[(long)(ptr + (__n - (long)pbVar15))] = 0;
              bVar14 = *pbVar8;
              if ((bVar14 == 0x27) || (__c = 0x3b, pbVar15 = pbVar8, bVar14 == 0x22)) {
                pbVar15 = pbVar8 + 1;
                __c = (uint)bVar14;
              }
              pcVar12 = strchr((char *)pbVar15,__c);
              if (pcVar12 != (char *)0x0) {
                *pcVar12 = '\0';
              }
              pcVar12 = strrchr((char *)pbVar15,0x2f);
              if (pcVar12 == (char *)0x0) {
LAB_0010b556:
                pcVar12 = strrchr((char *)pbVar15,0x5c);
                if (pcVar12 != (char *)0x0) {
                  if (pcVar12[1] == '\0') goto LAB_0010b5d5;
                  pbVar15 = (byte *)(pcVar12 + 1);
                }
                pcVar12 = strchr((char *)pbVar15,0xd);
                if (pcVar12 != (char *)0x0) {
                  *pcVar12 = '\0';
                }
                pcVar12 = strchr((char *)pbVar15,10);
                if (pcVar12 != (char *)0x0) {
                  *pcVar12 = '\0';
                }
                if (pbVar8 != pbVar15) {
                  sVar7 = strlen((char *)pbVar15);
                  memmove(pbVar8,pbVar15,sVar7 + 1);
                }
                if (*(long *)((long)userdata + 0xe0) != 0) {
                  free(pbVar8);
                  return 0xffffffff;
                }
                config = *(OperationConfig **)((long)userdata + 0x10);
                if (config->output_dir == (char *)0x0) {
                  outs->filename = (char *)pbVar8;
                }
                else {
                  pcVar12 = (char *)curl_maprintf("%s/%s",config->output_dir,pbVar8);
                  outs->filename = pcVar12;
                  free(pbVar8);
                  if (pcVar12 == (char *)0x0) {
                    return 0xffffffff;
                  }
                  config = *(OperationConfig **)((long)userdata + 0x10);
                }
                *(undefined4 *)((long)userdata + 0xd8) = 0x10101;
                *(undefined1 *)((long)userdata + 0x178) = 0;
                _Var5 = tool_create_output_file(outs,config);
                if (!_Var5) {
                  return 0xffffffff;
                }
                iVar6 = tool_write_headers(hdrcbdata,*(FILE **)((long)userdata + 0xe0));
                if (iVar6 != 0) {
                  return 0xffffffff;
                }
              }
              else {
                if (pcVar12[1] != '\0') {
                  pbVar15 = (byte *)(pcVar12 + 1);
                  goto LAB_0010b556;
                }
LAB_0010b5d5:
                free(pbVar8);
              }
            }
LAB_0010b5dd:
            stream = *(FILE **)((long)userdata + 0xe0);
            if (stream == (FILE *)0x0) {
              _Var5 = tool_create_output_file(outs,*(OperationConfig **)((long)userdata + 0x10));
              if (!_Var5) {
                return 0xffffffff;
              }
              stream = *(FILE **)((long)userdata + 0xe0);
            }
            iVar6 = tool_write_headers(hdrcbdata,stream);
            if (iVar6 != 0) {
              return 0xffffffff;
            }
          }
          if ((*(char *)((long)userdata + 0x178) == '\x01') &&
             (*(char *)(*(long *)((long)userdata + 0x150) + 0x1e7) == '\x01')) {
            pvVar10 = (void *)curl_maprintf("%.*s",__n & 0xffffffff,ptr);
            uVar4 = *(undefined8 *)((long)userdata + 0x170);
            if (pvVar10 == (void *)0x0) {
              curl_slist_free_all(uVar4);
              *(undefined8 *)((long)userdata + 0x170) = 0;
            }
            else {
              uVar9 = curl_slist_append(uVar4,pvVar10);
              *(undefined8 *)((long)userdata + 0x170) = uVar9;
              free(pvVar10);
              if (*(long *)((long)userdata + 0x170) != 0) {
                return __n;
              }
              curl_slist_free_all(uVar4);
            }
            return 0xffffffff;
          }
        }
      }
      else if (pbVar2[-1] == 10) {
        pbVar8 = pbVar2 + -1;
        sVar7 = __n - 5;
        for (pbVar15 = (byte *)(ptr + 5);
            ((*pbVar15 == 0x20 || (*pbVar15 == 9)) && (pbVar15 < pbVar8)); pbVar15 = pbVar15 + 1) {
          sVar7 = sVar7 - 1;
        }
        bVar14 = 10;
        while (((bVar14 == 9 || (bVar14 == 0x20)) || ((byte)(bVar14 - 10) < 4))) {
          pbVar1 = pbVar8 + -1;
          pbVar8 = pbVar8 + -1;
          sVar7 = sVar7 - 1;
          bVar14 = *pbVar1;
        }
        if (pbVar15 <= pbVar8) {
          iVar6 = fileno(*(FILE **)((long)userdata + 0x130));
          iVar6 = ftruncate64(iVar6,0);
          if (iVar6 != 0) {
            return 0xffffffff;
          }
          fwrite(pbVar15,size,sVar7,*(FILE **)((long)userdata + 0x130));
          fputc(10,*(FILE **)((long)userdata + 0x130));
          fflush(*(FILE **)((long)userdata + 0x130));
        }
      }
    }
  }
  lVar13 = *(long *)((long)userdata + 0x150);
  if (*(long *)(lVar13 + 0x358) != 0) {
    pvVar10 = memchr(ptr,0x3a,__n);
    if (pvVar10 == (void *)0x0) {
      if ((*ptr == '\r') || (*ptr == '\n')) {
        *(undefined1 *)((long)userdata + 0x1da) = 1;
      }
    }
    else {
      lVar11 = 1;
      if (*(char *)((long)userdata + 0x1da) == '\0') {
        lVar11 = *(long *)((long)userdata + 0x180) + 1;
      }
      *(undefined1 *)((long)userdata + 0x1da) = 0;
      *(long *)((long)userdata + 0x180) = lVar11;
    }
  }
  if (*(char *)(lVar13 + 0x1e7) != '\x01') {
    return __n;
  }
  if ((((local_40 != proto_http) && (local_40 != proto_https)) && (local_40 != proto_rtsp)) &&
     (local_40 != proto_file)) {
    return __n;
  }
  if ((*(long *)((long)userdata + 0xe0) == 0) &&
     (_Var5 = tool_create_output_file(outs,*(OperationConfig **)((long)userdata + 0x10)), !_Var5)) {
    return 0xffffffff;
  }
  if (((hdrcbdata->global->isatty != true) || (hdrcbdata->global->styled_output != true)) ||
     (pvVar10 = memchr(ptr,0x3a,__n), pvVar10 == (void *)0x0)) {
    __s = *(FILE **)((long)userdata + 0xe0);
    sVar7 = __n;
    goto LAB_0010b895;
  }
  uVar16 = (long)pvVar10 - (long)ptr;
  curl_mfprintf(*(undefined8 *)((long)userdata + 0xe0),"\x1b[1m%.*s\x1b[0m:",uVar16 & 0xffffffff,ptr
               );
  iVar6 = curl_strnequal("Location",ptr,uVar16);
  if (iVar6 == 0) {
    ptr = (char *)((long)pvVar10 + 1);
    __s = *(FILE **)((long)userdata + 0xe0);
    sVar7 = ~uVar16 + __n;
    goto LAB_0010b895;
  }
  uVar4 = *(undefined8 *)((long)userdata + 0x20);
  __s = *(FILE **)((long)userdata + 0xe0);
  ptr = (char *)((long)pvVar10 + 1);
  sVar7 = ~uVar16 + __n;
  pbVar15 = (byte *)0x0;
  local_48 = 0;
  local_50 = (char *)0x0;
  local_58 = 0;
  pcVar12 = getenv("VTE_VERSION");
  if ((pcVar12 != (char *)0x0) && (lVar13 = strtol(pcVar12,(char **)0x0,10), lVar13 - 1U < 0x12c1))
  goto LAB_0010b895;
  if (sVar7 == 0) {
    pbVar8 = (byte *)0x0;
    local_60 = ptr;
  }
  else {
    local_60 = ptr + sVar7;
    pbVar8 = (byte *)0x0;
    pbVar15 = (byte *)0x0;
    do {
      if ((ptr[(long)pbVar15] != '\t') && (ptr[(long)pbVar15] != ' ')) {
        local_60 = ptr + (long)pbVar15;
        pbVar8 = (byte *)0x0;
        lVar13 = 0;
        goto LAB_0010b901;
      }
      pbVar15 = pbVar15 + 1;
    } while (pbVar2 + ~(ulong)pvVar10 != pbVar15);
    pbVar15 = (byte *)(sVar7 & 0xffffffff);
  }
  goto LAB_0010b92c;
  while (lVar11 = lVar13 - (long)pvVar10, lVar13 = lVar13 + -1, pbVar2 + lVar11 + -2 != pbVar15) {
LAB_0010b901:
    cVar3 = *(char *)((long)pvVar10 + lVar13 + sVar7);
    if ((cVar3 != '\r') && (cVar3 != '\n')) {
      pbVar8 = pbVar2 + lVar13 + (-(long)pbVar15 - (long)pvVar10) + -1;
      break;
    }
  }
LAB_0010b92c:
  lVar13 = curl_url();
  if (lVar13 == 0) {
LAB_0010b895:
    fwrite(ptr,sVar7,1,__s);
    return __n;
  }
  pvVar10 = malloc((size_t)(pbVar8 + 1));
  if (pvVar10 != (void *)0x0) {
    local_38 = lVar13;
    memcpy(pvVar10,local_60,(size_t)pbVar8);
    lVar13 = local_38;
    *(byte *)((long)pvVar10 + (long)pbVar8) = 0;
    iVar6 = curl_easy_getinfo(uVar4,0x100001,&local_48);
    if (((((iVar6 == 0) && (iVar6 = curl_url_set(lVar13,0,local_48,0), iVar6 == 0)) &&
         (iVar6 = curl_url_set(lVar13,0,pvVar10,0), iVar6 == 0)) &&
        ((iVar6 = curl_url_get(lVar13,0,&local_58,2), iVar6 == 0 &&
         (iVar6 = curl_url_get(lVar13,1,&local_50,0), pcVar12 = local_50, iVar6 == 0)))) &&
       (((iVar6 = strcmp("http",local_50), iVar6 == 0 ||
         ((iVar6 = strcmp("https",pcVar12), iVar6 == 0 ||
          (iVar6 = strcmp("ftp",pcVar12), iVar6 == 0)))) ||
        (iVar6 = strcmp("ftps",pcVar12), iVar6 == 0)))) {
      curl_mfprintf(__s,"%.*s\x1b]8;;%s\x1b\\%.*s\x1b]8;;\x1b\\",(ulong)pbVar15 & 0xffffffff,ptr,
                    local_58,(int)sVar7 - (int)pbVar15,local_60);
      goto LAB_0010ba06;
    }
  }
  fwrite(ptr,sVar7,1,__s);
LAB_0010ba06:
  curl_free(local_58);
  curl_free(local_50);
  curl_url_cleanup(lVar13);
  free(pvVar10);
  return __n;
}

Assistant:

size_t tool_header_cb(char *ptr, size_t size, size_t nmemb, void *userdata)
{
  struct per_transfer *per = userdata;
  struct HdrCbData *hdrcbdata = &per->hdrcbdata;
  struct OutStruct *outs = &per->outs;
  struct OutStruct *heads = &per->heads;
  struct OutStruct *etag_save = &per->etag_save;
  const char *str = ptr;
  const size_t cb = size * nmemb;
  const char *end = (char *)ptr + cb;
  const char *scheme = NULL;

  if(!per->config)
    return CURL_WRITEFUNC_ERROR;

#ifdef DEBUGBUILD
  if(size * nmemb > (size_t)CURL_MAX_HTTP_HEADER) {
    warnf(per->config->global, "Header data exceeds single call write limit");
    return CURL_WRITEFUNC_ERROR;
  }
#endif

#ifdef _WIN32
  /* Discard incomplete UTF-8 sequence buffered from body */
  if(outs->utf8seq[0])
    memset(outs->utf8seq, 0, sizeof(outs->utf8seq));
#endif

  /*
   * Write header data when curl option --dump-header (-D) is given.
   */

  if(per->config->headerfile && heads->stream) {
    size_t rc = fwrite(ptr, size, nmemb, heads->stream);
    if(rc != cb)
      return rc;
    /* flush the stream to send off what we got earlier */
    if(fflush(heads->stream)) {
      errorf(per->config->global, "Failed writing headers to %s",
             per->config->headerfile);
      return CURL_WRITEFUNC_ERROR;
    }
  }

  curl_easy_getinfo(per->curl, CURLINFO_SCHEME, &scheme);
  scheme = proto_token(scheme);
  if((scheme == proto_http || scheme == proto_https)) {
    long response = 0;
    curl_easy_getinfo(per->curl, CURLINFO_RESPONSE_CODE, &response);

    if((response/100 != 2) && (response/100 != 3))
      /* only care about etag and content-disposition headers in 2xx and 3xx
         responses */
      ;
    /*
     * Write etag to file when --etag-save option is given.
     */
    else if(per->config->etag_save_file && etag_save->stream &&
            /* match only header that start with etag (case insensitive) */
            checkprefix("etag:", str)) {
      const char *etag_h = &str[5];
      const char *eot = end - 1;
      if(*eot == '\n') {
        while(ISBLANK(*etag_h) && (etag_h < eot))
          etag_h++;
        while(ISSPACE(*eot))
          eot--;

        if(eot >= etag_h) {
          size_t etag_length = eot - etag_h + 1;
          /*
           * Truncate the etag save stream, it can have an existing etag value.
           */
#ifdef HAVE_FTRUNCATE
          if(ftruncate(fileno(etag_save->stream), 0)) {
            return CURL_WRITEFUNC_ERROR;
          }
#else
          if(fseek(etag_save->stream, 0, SEEK_SET)) {
            return CURL_WRITEFUNC_ERROR;
          }
#endif

          fwrite(etag_h, size, etag_length, etag_save->stream);
          /* terminate with newline */
          fputc('\n', etag_save->stream);
          (void)fflush(etag_save->stream);
        }
      }
    }

    /*
     * This callback sets the filename where output shall be written when
     * curl options --remote-name (-O) and --remote-header-name (-J) have
     * been simultaneously given and additionally server returns an HTTP
     * Content-Disposition header specifying a filename property.
     */

    else if(hdrcbdata->honor_cd_filename) {
      if((cb > 20) && checkprefix("Content-disposition:", str)) {
        const char *p = str + 20;

        /* look for the 'filename=' parameter
           (encoded filenames (*=) are not supported) */
        for(;;) {
          char *filename;
          size_t len;

          while((p < end) && *p && !ISALPHA(*p))
            p++;
          if(p > end - 9)
            break;

          if(memcmp(p, "filename=", 9)) {
            /* no match, find next parameter */
            while((p < end) && *p && (*p != ';'))
              p++;
            if((p < end) && *p)
              continue;
            else
              break;
          }
          p += 9;

          len = cb - (size_t)(p - str);
          filename = parse_filename(p, len);
          if(filename) {
            if(outs->stream) {
              /* indication of problem, get out! */
              free(filename);
              return CURL_WRITEFUNC_ERROR;
            }

            if(per->config->output_dir) {
              outs->filename = aprintf("%s/%s", per->config->output_dir,
                                       filename);
              free(filename);
              if(!outs->filename)
                return CURL_WRITEFUNC_ERROR;
            }
            else
              outs->filename = filename;

            outs->is_cd_filename = TRUE;
            outs->s_isreg = TRUE;
            outs->fopened = FALSE;
            outs->alloc_filename = TRUE;
            hdrcbdata->honor_cd_filename = FALSE; /* done now! */
            if(!tool_create_output_file(outs, per->config))
              return CURL_WRITEFUNC_ERROR;
            if(tool_write_headers(&per->hdrcbdata, outs->stream))
              return CURL_WRITEFUNC_ERROR;
          }
          break;
        }
        if(!outs->stream && !tool_create_output_file(outs, per->config))
          return CURL_WRITEFUNC_ERROR;
        if(tool_write_headers(&per->hdrcbdata, outs->stream))
          return CURL_WRITEFUNC_ERROR;
      } /* content-disposition handling */

      if(hdrcbdata->honor_cd_filename &&
         hdrcbdata->config->show_headers) {
        /* still awaiting the Content-Disposition header, store the header in
           memory. Since it is not zero terminated, we need an extra dance. */
        char *clone = aprintf("%.*s", (int)cb, (char *)str);
        if(clone) {
          struct curl_slist *old = hdrcbdata->headlist;
          hdrcbdata->headlist = curl_slist_append(old, clone);
          free(clone);
          if(!hdrcbdata->headlist) {
            curl_slist_free_all(old);
            return CURL_WRITEFUNC_ERROR;
          }
        }
        else {
          curl_slist_free_all(hdrcbdata->headlist);
          hdrcbdata->headlist = NULL;
          return CURL_WRITEFUNC_ERROR;
        }
        return cb; /* done for now */
      }
    }
  }
  if(hdrcbdata->config->writeout) {
    char *value = memchr(ptr, ':', cb);
    if(value) {
      if(per->was_last_header_empty)
        per->num_headers = 0;
      per->was_last_header_empty = FALSE;
      per->num_headers++;
    }
    else if(ptr[0] == '\r' || ptr[0] == '\n')
      per->was_last_header_empty = TRUE;
  }
  if(hdrcbdata->config->show_headers &&
    (scheme == proto_http || scheme == proto_https ||
     scheme == proto_rtsp || scheme == proto_file)) {
    /* bold headers only for selected protocols */
    char *value = NULL;

    if(!outs->stream && !tool_create_output_file(outs, per->config))
      return CURL_WRITEFUNC_ERROR;

    if(hdrcbdata->global->isatty &&
#ifdef _WIN32
       tool_term_has_bold &&
#endif
       hdrcbdata->global->styled_output)
      value = memchr(ptr, ':', cb);
    if(value) {
      size_t namelen = value - ptr;
      fprintf(outs->stream, BOLD "%.*s" BOLDOFF ":", (int)namelen, ptr);
#ifndef LINK
      fwrite(&value[1], cb - namelen - 1, 1, outs->stream);
#else
      if(curl_strnequal("Location", ptr, namelen)) {
        write_linked_location(per->curl, &value[1], cb - namelen - 1,
            outs->stream);
      }
      else
        fwrite(&value[1], cb - namelen - 1, 1, outs->stream);
#endif
    }
    else
      /* not "handled", just show it */
      fwrite(ptr, cb, 1, outs->stream);
  }
  return cb;
}